

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  if ((this->m_info).capturedExpression._M_string_length == 0) {
    bVar4 = false;
  }
  else {
    pcVar1 = (this->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,
               pcVar1 + (this->m_resultData).reconstructedExpression._M_string_length);
    pcVar1 = (this->m_info).capturedExpression._M_dataplus._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,
               pcVar1 + (this->m_info).capturedExpression._M_string_length);
    plVar2 = local_40;
    if (local_58 == local_38) {
      if (local_58 == 0) {
        bVar4 = false;
      }
      else {
        iVar3 = bcmp(local_60,local_40,local_58);
        bVar4 = iVar3 != 0;
      }
    }
    else {
      bVar4 = true;
    }
    if (plVar2 != local_30) {
      operator_delete(plVar2,local_30[0] + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
  }
  return bVar4;
}

Assistant:

ExpressionLhs<bool> operator->* ( bool value ) {
        return ExpressionLhs<bool>( value );
    }